

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  CompareOp op_00;
  cmMakefile *pcVar1;
  static_string_view key_2;
  static_string_view key_2_00;
  static_string_view key_2_01;
  CurrentAndTwoMoreIter args_00;
  CurrentAndTwoMoreIter args_01;
  CurrentAndTwoMoreIter args_02;
  CurrentAndTwoMoreIter args_03;
  CurrentAndTwoMoreIter args_04;
  CurrentAndTwoMoreIter args_05;
  CurrentAndTwoMoreIter args_06;
  CurrentAndTwoMoreIter args_07;
  static_string_view key_3;
  static_string_view key_3_00;
  static_string_view key_3_01;
  static_string_view key_4;
  static_string_view key_4_00;
  static_string_view key_4_01;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view key_1;
  static_string_view key;
  static_string_view key_1_00;
  static_string_view key_00;
  static_string_view key_1_01;
  static_string_view key_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  int lhs_00;
  reference pcVar5;
  string *psVar6;
  string *psVar7;
  pointer pcVar8;
  ostream *poVar9;
  PolicyID id;
  PolicyID id_00;
  string_view str;
  bool local_c41;
  bool local_c2d;
  bool local_c12;
  bool local_bc1;
  bool local_bb1;
  CurrentAndTwoMoreIter local_ba0;
  string local_b88;
  string local_b68;
  undefined1 local_b48 [8];
  ostringstream e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  cmCMakePath local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  cmCMakePath local_950;
  undefined1 local_921;
  cmValue cStack_920;
  bool result_3;
  cmValue rhs_4;
  cmValue lhs_4;
  string local_900;
  string local_8e0;
  undefined1 local_8c0 [8];
  ostringstream e;
  cmList local_720;
  cmValue local_708;
  cmValue rhs_3;
  cmValue lhs_3;
  Status local_6cc;
  Status ftcStatus;
  int fileIsNewer;
  cmValue cStack_690;
  bool result_2;
  cmValue rhs_2;
  cmValue lhs_2;
  CompareOp op;
  bool result_1;
  cmValue cStack_608;
  int val;
  cmValue rhs_1;
  cmValue lhs_1;
  undefined1 auStack_588 [7];
  bool result;
  anon_class_32_4_a10dce1b parseDoubles;
  double rhs;
  double lhs;
  cmValue rdef;
  cmValue ldef;
  string local_4d8 [3];
  bool match;
  undefined1 local_4b8 [8];
  ostringstream error;
  undefined1 local_340 [8];
  RegularExpression regEntry;
  string *rex;
  string_view local_100;
  cmValue local_e0;
  undefined1 local_d8 [8];
  string def_buf;
  cmValue def;
  _Self local_a0;
  _Self local_98;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  size_t local_78;
  char *local_70;
  _Self local_68;
  int local_5c;
  iterator iStack_58;
  int matchNo;
  undefined1 auStack_50 [8];
  CurrentAndTwoMoreIter args;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  args.nextnext._M_node = (_List_node_base *)status;
  cmArgumentList::make3ArgsIterator((CurrentAndTwoMoreIter *)auStack_50,newArgs);
  while( true ) {
    iStack_58 = std::__cxx11::
                list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                          (&newArgs->
                            super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                          );
    bVar4 = std::operator!=((_Self *)auStack_50,&stack0xffffffffffffffa8);
    if (!bVar4) break;
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         end(&newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
    bVar4 = std::operator!=(&args.current,&local_68);
    local_bb1 = false;
    if (bVar4) {
      local_78 = (anonymous_namespace)::keyMATCHES;
      local_70 = DAT_016aa898;
      pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                         ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
      keyword_03.super_string_view._M_str = local_70;
      keyword_03.super_string_view._M_len = local_78;
      local_bb1 = IsKeyword(this,keyword_03,pcVar5);
    }
    if (local_bb1 == false) {
      local_98._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(&newArgs->
                  super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>)
      ;
      bVar4 = std::operator==(&args.current,&local_98);
      local_bc1 = true;
      if (!bVar4) {
        local_a0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (&newArgs->
                         super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                       );
        local_bc1 = std::operator==(&args.next,&local_a0);
      }
      pcVar3 = DAT_016aa898;
      sVar2 = (anonymous_namespace)::keyMATCHES;
      if (local_bc1 == false) {
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
        keyword_02.super_string_view._M_str = pcVar3;
        keyword_02.super_string_view._M_len = sVar2;
        bVar4 = IsKeyword(this,keyword_02,pcVar5);
        if (bVar4) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                             ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
          def_buf.field_2._8_8_ = GetDefinitionIfUnquoted(this,pcVar5);
          std::__cxx11::string::string((string *)local_d8);
          bVar4 = cmValue::operator_cast_to_bool((cmValue *)((long)&def_buf.field_2 + 8));
          if (bVar4) {
            pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                               ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
            psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
            str = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
            local_100 = str;
            bVar4 = cmHasLiteralPrefix<13ul>(str,(char (*) [13])"CMAKE_MATCH_");
            if (bVar4) {
              psVar6 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&def_buf.field_2 + 8));
              std::__cxx11::string::operator=((string *)local_d8,(string *)psVar6);
              cmValue::cmValue((cmValue *)&rex,(string *)local_d8);
              def_buf.field_2._8_8_ = rex;
            }
          }
          else {
            pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                               ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
            psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
            cmValue::cmValue(&local_e0,psVar6);
            def_buf.field_2._8_8_ = local_e0.Value;
          }
          cmMakefile::ClearMatches(this->Makefile);
          pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.next);
          regEntry._552_8_ = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
          cmsys::RegularExpression::RegularExpression((RegularExpression *)local_340);
          bVar4 = cmsys::RegularExpression::compile
                            ((RegularExpression *)local_340,(string *)regEntry._552_8_);
          if (bVar4) {
            psVar6 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&def_buf.field_2 + 8));
            bVar4 = cmsys::RegularExpression::find((RegularExpression *)local_340,psVar6);
            if (bVar4) {
              cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_340);
            }
            args_01.next._M_node = args.current._M_node;
            args_01.current._M_node = (_List_node_base *)auStack_50;
            args_01.nextnext._M_node = args.next._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_01);
            bVar4 = false;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
            poVar9 = std::operator<<((ostream *)local_4b8,"Regular expression \"");
            poVar9 = std::operator<<(poVar9,(string *)regEntry._552_8_);
            std::operator<<(poVar9,"\" cannot compile");
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)errorString,local_4d8);
            std::__cxx11::string::~string(local_4d8);
            *(undefined4 *)&(args.nextnext._M_node)->_M_next = 2;
            this_local._7_1_ = 0;
            bVar4 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
          }
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_340);
          std::__cxx11::string::~string((string *)local_d8);
          if (bVar4) goto LAB_00af6ac6;
        }
        else {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
          key_01.super_string_view._M_str = DAT_016aa878;
          key_01.super_string_view._M_len = (anonymous_namespace)::keyLESS;
          key_1_01.super_string_view._M_str = DAT_016aa888;
          key_1_01.super_string_view._M_len = (anonymous_namespace)::keyLESS_EQUAL;
          key_2.super_string_view._M_str = DAT_016aa808;
          key_2.super_string_view._M_len = (anonymous_namespace)::keyGREATER;
          key_3.super_string_view._M_str = DAT_016aa818;
          key_3.super_string_view._M_len = (anonymous_namespace)::keyGREATER_EQUAL;
          key_4.super_string_view._M_str = DAT_016aa7b8;
          key_4.super_string_view._M_len = (anonymous_namespace)::keyEQUAL;
          local_5c = matchKeys<cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                               (this,pcVar5,key_01,key_1_01,key_2,key_3,key_4);
          if (local_5c == 0) {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
            key_00.super_string_view._M_str = DAT_016aa928;
            key_00.super_string_view._M_len = (anonymous_namespace)::keySTRLESS;
            key_1_00.super_string_view._M_str = DAT_016aa938;
            key_1_00.super_string_view._M_len = (anonymous_namespace)::keySTRLESS_EQUAL;
            key_2_00.super_string_view._M_str = DAT_016aa908;
            key_2_00.super_string_view._M_len = (anonymous_namespace)::keySTRGREATER;
            key_3_00.super_string_view._M_str = DAT_016aa918;
            key_3_00.super_string_view._M_len = (anonymous_namespace)::keySTRGREATER_EQUAL;
            key_4_00.super_string_view._M_str = DAT_016aa8f8;
            key_4_00.super_string_view._M_len = (anonymous_namespace)::keySTREQUAL;
            local_5c = matchKeys<cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                                 (this,pcVar5,key_00,key_1_00,key_2_00,key_3_00,key_4_00);
            if (local_5c == 0) {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
              key.super_string_view._M_str = DAT_016aa998;
              key.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS;
              key_1.super_string_view._M_str = DAT_016aa9a8;
              key_1.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS_EQUAL;
              key_2_01.super_string_view._M_str = DAT_016aa978;
              key_2_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_GREATER;
              key_3_01.super_string_view._M_str = DAT_016aa988;
              key_3_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_GREATER_EQUAL;
              key_4_01.super_string_view._M_str = DAT_016aa968;
              key_4_01.super_string_view._M_len = (anonymous_namespace)::keyVERSION_EQUAL;
              local_5c = matchKeys<cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view,cm::static_string_view>
                                   (this,pcVar5,key,key_1,key_2_01,key_3_01,key_4_01);
              pcVar3 = DAT_016aa858;
              if (local_5c == 0) {
                stack0xfffffffffffff940 = (anonymous_namespace)::keyIS_NEWER_THAN;
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
                keyword_01.super_string_view._M_str = pcVar3;
                keyword_01.super_string_view._M_len = stack0xfffffffffffff940;
                bVar4 = IsKeyword(this,keyword_01,pcVar5);
                pcVar3 = DAT_016aa828;
                sVar2 = (anonymous_namespace)::keyIN_LIST;
                if (bVar4) {
                  ftcStatus.Kind_ = Success;
                  pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                     ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
                  psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
                  pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.next);
                  psVar7 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
                  local_6cc = cmsys::SystemTools::FileTimeCompare(psVar6,psVar7,(int *)&ftcStatus);
                  bVar4 = cmsys::Status::operator_cast_to_bool(&local_6cc);
                  local_c2d = true;
                  if ((bVar4) && (local_c2d = true, ftcStatus.Kind_ != POSIX)) {
                    local_c2d = ftcStatus.Kind_ == Success;
                  }
                  args_05.next._M_node = args.current._M_node;
                  args_05.current._M_node = (_List_node_base *)auStack_50;
                  args_05.nextnext._M_node = args.next._M_node;
                  cmArgumentList::ReduceTwoArgs(newArgs,local_c2d,args_05);
                }
                else {
                  pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.current);
                  keyword_00.super_string_view._M_str = pcVar3;
                  keyword_00.super_string_view._M_len = sVar2;
                  bVar4 = IsKeyword(this,keyword_00,pcVar5);
                  pcVar3 = DAT_016aa9b8;
                  sVar2 = (anonymous_namespace)::keyPATH_EQUAL;
                  if (bVar4) {
                    if ((this->Policy57Status == OLD) || (this->Policy57Status == WARN)) {
                      if (this->Policy57Status == WARN) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c0);
                        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_8e0,(cmPolicies *)0x39,id);
                        poVar9 = std::operator<<((ostream *)local_8c0,(string *)&local_8e0);
                        std::operator<<(poVar9,
                                        "\nIN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                       );
                        std::__cxx11::string::~string((string *)&local_8e0);
                        pcVar1 = this->Makefile;
                        std::__cxx11::ostringstream::str();
                        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_900);
                        std::__cxx11::string::~string((string *)&local_900);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c0);
                      }
                    }
                    else {
                      pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                         ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
                      rhs_3 = GetVariableOrString(this,pcVar5);
                      pcVar1 = this->Makefile;
                      pcVar8 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                         (&args.next);
                      psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar8);
                      local_708 = cmMakefile::GetDefinition(pcVar1,psVar6);
                      bVar4 = cmValue::operator_cast_to_bool(&local_708);
                      local_c41 = false;
                      if (bVar4) {
                        psVar6 = cmValue::operator*[abi_cxx11_(&local_708);
                        cmList::cmList(&local_720,psVar6,Yes);
                        psVar6 = cmValue::operator*[abi_cxx11_(&rhs_3);
                        local_c41 = ::cm::
                                    contains<cmList,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                              (&local_720,psVar6);
                      }
                      args_06.next._M_node = args.current._M_node;
                      args_06.current._M_node = (_List_node_base *)auStack_50;
                      args_06.nextnext._M_node = args.next._M_node;
                      cmArgumentList::ReduceTwoArgs(newArgs,local_c41,args_06);
                      if (bVar4) {
                        cmList::~cmList(&local_720);
                      }
                    }
                  }
                  else {
                    pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                       (&args.current);
                    keyword.super_string_view._M_str = pcVar3;
                    keyword.super_string_view._M_len = sVar2;
                    bVar4 = IsKeyword(this,keyword,pcVar5);
                    if (bVar4) {
                      if ((this->Policy139Status == OLD) || (this->Policy139Status == WARN)) {
                        if (this->Policy139Status == WARN) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b48);
                          cmPolicies::GetPolicyWarning_abi_cxx11_
                                    (&local_b68,(cmPolicies *)0x8b,id_00);
                          poVar9 = std::operator<<((ostream *)local_b48,(string *)&local_b68);
                          std::operator<<(poVar9,
                                          "\nPATH_EQUAL will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                         );
                          std::__cxx11::string::~string((string *)&local_b68);
                          pcVar1 = this->Makefile;
                          std::__cxx11::ostringstream::str();
                          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_b88);
                          std::__cxx11::string::~string((string *)&local_b88);
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b48);
                        }
                      }
                      else {
                        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                           ((_List_iterator<cmExpandedCommandArgument> *)auStack_50)
                        ;
                        rhs_4 = GetVariableOrString(this,pcVar5);
                        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                           (&args.next);
                        cStack_920 = GetVariableOrString(this,pcVar5);
                        psVar6 = cmValue::operator*[abi_cxx11_(&rhs_4);
                        std::__cxx11::string::string((string *)&local_970,(string *)psVar6);
                        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                  (&local_950,&local_970,generic_format);
                        psVar6 = cmValue::operator*[abi_cxx11_(&stack0xfffffffffffff6e0);
                        std::__cxx11::string::string((string *)&local_9b8,(string *)psVar6);
                        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                  (&local_998,&local_9b8,generic_format);
                        bVar4 = ::operator==(&local_950,&local_998);
                        cmCMakePath::~cmCMakePath(&local_998);
                        std::__cxx11::string::~string((string *)&local_9b8);
                        cmCMakePath::~cmCMakePath(&local_950);
                        std::__cxx11::string::~string((string *)&local_970);
                        args_07.next._M_node = args.current._M_node;
                        args_07.current._M_node = (_List_node_base *)auStack_50;
                        args_07.nextnext._M_node = args.next._M_node;
                        local_921 = bVar4;
                        cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_07);
                      }
                    }
                  }
                }
              }
              else {
                op_00 = *(CompareOp *)
                         ((anonymous_namespace)::MATCH2CMPOP + (long)(local_5c + -1) * 4);
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                   ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
                rhs_2 = GetVariableOrString(this,pcVar5);
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.next);
                cStack_690 = GetVariableOrString(this,pcVar5);
                psVar6 = cmValue::operator_cast_to_string_(&rhs_2);
                psVar7 = cmValue::operator_cast_to_string_(&stack0xfffffffffffff970);
                bVar4 = cmSystemTools::VersionCompare(op_00,psVar6,psVar7);
                args_04.next._M_node = args.current._M_node;
                args_04.current._M_node = (_List_node_base *)auStack_50;
                args_04.nextnext._M_node = args.next._M_node;
                cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_04);
              }
            }
            else {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                 ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
              rhs_1 = GetVariableOrString(this,pcVar5);
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.next);
              cStack_608 = GetVariableOrString(this,pcVar5);
              psVar6 = cmValue::operator*[abi_cxx11_(&rhs_1);
              cmValue::operator*[abi_cxx11_(&stack0xfffffffffffff9f8);
              lhs_00 = std::__cxx11::string::compare((string *)psVar6);
              bVar4 = anon_unknown.dwarf_191867c::
                      cmRt2CtSelector<std::less,_std::less_equal,_std::greater,_std::greater_equal,_std::equal_to>
                      ::eval<int>(local_5c,lhs_00,0);
              args_03.next._M_node = args.current._M_node;
              args_03.current._M_node = (_List_node_base *)auStack_50;
              args_03.nextnext._M_node = args.next._M_node;
              cmArgumentList::ReduceTwoArgs(newArgs,bVar4,args_03);
            }
          }
          else {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                               ((_List_iterator<cmExpandedCommandArgument> *)auStack_50);
            rdef = GetVariableOrString(this,pcVar5);
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&args.next);
            lhs = (double)GetVariableOrString(this,pcVar5);
            _auStack_588 = &rdef;
            parseDoubles.ldef = (cmValue *)&rhs;
            parseDoubles.lhs = &lhs;
            parseDoubles.rdef = (cmValue *)&parseDoubles.rhs;
            bVar4 = HandleLevel2::anon_class_32_4_a10dce1b::operator()
                              ((anon_class_32_4_a10dce1b *)auStack_588);
            local_c12 = false;
            if (bVar4) {
              local_c12 = anon_unknown.dwarf_191867c::
                          cmRt2CtSelector<std::less,_std::less_equal,_std::greater,_std::greater_equal,_std::equal_to>
                          ::eval<double>(local_5c,rhs,(double)parseDoubles.rhs);
            }
            args_02.next._M_node = args.current._M_node;
            args_02.current._M_node = (_List_node_base *)auStack_50;
            args_02.nextnext._M_node = args.next._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,local_c12,args_02);
          }
        }
      }
    }
    else {
      local_90 = (_List_node_base *)auStack_50;
      local_88 = args.current._M_node;
      local_80 = args.next._M_node;
      args_00.next._M_node = args.current._M_node;
      args_00.current._M_node = (_List_node_base *)auStack_50;
      args_00.nextnext._M_node = args.next._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter>
                (newArgs,false,args_00);
    }
    cmArgumentList::CurrentAndTwoMoreIter::advance
              (&local_ba0,(CurrentAndTwoMoreIter *)auStack_50,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  this_local._7_1_ = 1;
LAB_00af6ac6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    // NOTE Handle special case `if(... BLAH_BLAH MATCHES)`
    // (i.e., w/o regex to match which is possibly result of
    // variable expansion to an empty string)
    if (args.next != newArgs.end() &&
        this->IsKeyword(keyMATCHES, *args.current)) {
      newArgs.ReduceOneArg(false, args);
    }

    // NOTE Fail fast: All the binary ops below require 2 arguments.
    else if (args.next == newArgs.end() || args.nextnext == newArgs.end()) {
      continue;
    }

    else if (this->IsKeyword(keyMATCHES, *args.next)) {
      cmValue def = this->GetDefinitionIfUnquoted(*args.current);

      std::string def_buf;
      if (!def) {
        def = cmValue(args.current->GetValue());
      } else if (cmHasLiteralPrefix(args.current->GetValue(),
                                    "CMAKE_MATCH_")) {
        // The string to match is owned by our match result variables.
        // Move it to our own buffer before clearing them.
        def_buf = *def;
        def = cmValue(def_buf);
      }

      this->Makefile.ClearMatches();

      const auto& rex = args.nextnext->GetValue();
      cmsys::RegularExpression regEntry;
      if (!regEntry.compile(rex)) {
        std::ostringstream error;
        error << "Regular expression \"" << rex << "\" cannot compile";
        errorString = error.str();
        status = MessageType::FATAL_ERROR;
        return false;
      }

      const auto match = regEntry.find(*def);
      if (match) {
        this->Makefile.StoreMatches(regEntry);
      }
      newArgs.ReduceTwoArgs(match, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyLESS, keyLESS_EQUAL, keyGREATER,
                                keyGREATER_EQUAL, keyEQUAL))) {

      cmValue ldef = this->GetVariableOrString(*args.current);
      cmValue rdef = this->GetVariableOrString(*args.nextnext);

      double lhs;
      double rhs;
      auto parseDoubles = [&]() {
        return std::sscanf(ldef->c_str(), "%lg", &lhs) == 1 &&
          std::sscanf(rdef->c_str(), "%lg", &rhs) == 1;
      };
      // clang-format off
      const auto result = parseDoubles() &&
        cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo = this->matchKeys(*args.next, keySTRLESS,
                                        keySTRLESS_EQUAL, keySTRGREATER,
                                        keySTRGREATER_EQUAL, keySTREQUAL))) {

      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto val = (*lhs).compare(*rhs);
      // clang-format off
      const auto result = cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, val, 0);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyVERSION_LESS,
                                keyVERSION_LESS_EQUAL, keyVERSION_GREATER,
                                keyVERSION_GREATER_EQUAL, keyVERSION_EQUAL))) {
      const auto op = MATCH2CMPOP[matchNo - 1];
      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto result = cmSystemTools::VersionCompare(op, lhs, rhs);
      newArgs.ReduceTwoArgs(result, args);
    }

    // is file A newer than file B
    else if (this->IsKeyword(keyIS_NEWER_THAN, *args.next)) {
      auto fileIsNewer = 0;
      cmsys::Status ftcStatus = cmSystemTools::FileTimeCompare(
        args.current->GetValue(), args.nextnext->GetValue(), &fileIsNewer);
      newArgs.ReduceTwoArgs(
        (!ftcStatus || fileIsNewer == 1 || fileIsNewer == 0), args);
    }

    else if (this->IsKeyword(keyIN_LIST, *args.next)) {

      if (this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->Makefile.GetDefinition(args.nextnext->GetValue());

        newArgs.ReduceTwoArgs(
          rhs &&
            cm::contains(cmList{ *rhs, cmList::EmptyElements::Yes }, *lhs),
          args);
      }

      else if (this->Policy57Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057)
          << "\n"
             "IN_LIST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }

    else if (this->IsKeyword(keyPATH_EQUAL, *args.next)) {

      if (this->Policy139Status != cmPolicies::OLD &&
          this->Policy139Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->GetVariableOrString(*args.nextnext);
        const auto result = cmCMakePath{ *lhs } == cmCMakePath{ *rhs };
        newArgs.ReduceTwoArgs(result, args);
      }

      else if (this->Policy139Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0139)
          << "\n"
             "PATH_EQUAL will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }
  }
  return true;
}